

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint *ilimit_w;
  BYTE *iStart;
  uint *iEnd;
  uint *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  size_t sVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  uint *puVar22;
  uint *puVar23;
  ulong uVar24;
  long lVar25;
  uint *puVar26;
  uint *iend;
  uint *ip;
  ulong uVar27;
  BYTE *pBVar28;
  ulong uVar29;
  BYTE *pBVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  seqDef *psVar35;
  int iVar36;
  uint *puVar37;
  uint *puVar38;
  ulong uVar39;
  U32 UVar40;
  uint *puVar41;
  uint local_fc;
  ulong local_e8;
  
  uVar15 = (ms->cParams).targetLength;
  uVar16 = (ulong)(uVar15 + 1 + (uint)(uVar15 == 0));
  pBVar5 = (ms->window).base;
  iVar11 = (int)pBVar5;
  iVar8 = (int)src - iVar11;
  iVar36 = (int)srcSize + iVar8;
  uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar15 = (ms->window).lowLimit;
  uVar9 = iVar36 - uVar31;
  if (iVar36 - uVar15 <= uVar31) {
    uVar9 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    uVar9 = uVar15;
  }
  uVar15 = (ms->window).dictLimit;
  if (uVar15 <= uVar9) {
    sVar18 = ZSTD_compressBlock_fast(ms,seqStore,rep,src,srcSize);
    return sVar18;
  }
  pUVar6 = ms->hashTable;
  pBVar7 = (ms->window).dictBase;
  iStart = pBVar5 + uVar15;
  puVar22 = (uint *)(pBVar7 + uVar15);
  iEnd = (uint *)((long)src + srcSize);
  puVar1 = (uint *)((long)src + (srcSize - 8));
  uVar31 = *rep;
  uVar3 = rep[1];
  uVar13 = iVar8 - uVar9;
  if (uVar3 < uVar13) {
    local_fc = uVar3;
    uVar3 = 0;
  }
  else {
    local_fc = 0;
  }
  uVar14 = uVar31;
  if (uVar31 < uVar13) {
    uVar14 = 0;
  }
  uVar4 = (ms->cParams).hashLog;
  if (uVar31 >= uVar13) {
    uVar31 = 0;
  }
  cVar12 = (char)uVar4;
  bVar19 = 0x40 - cVar12;
  bVar20 = 0x20 - cVar12;
  ilimit_w = iEnd + -8;
  ip = (uint *)src;
  do {
    puVar37 = (uint *)((long)ip + uVar16 + 1);
    if (puVar1 <= puVar37) {
LAB_0059f137:
      uVar15 = uVar14;
      if (uVar31 == 0) {
        uVar31 = uVar14;
        uVar15 = uVar3;
      }
      if (uVar14 == 0) {
        uVar15 = uVar3;
      }
      if (local_fc != 0) {
        uVar15 = local_fc;
      }
      *rep = uVar31;
      rep[1] = uVar15;
      return (long)iEnd - (long)ip;
    }
    if (0x20 < uVar4) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    uVar13 = mls - 5;
    uVar24 = (ulong)uVar13;
    switch(uVar24) {
    case 0:
      lVar25 = -0x30e4432345000000;
      break;
    case 1:
      lVar25 = -0x30e4432340650000;
      break;
    case 2:
      lVar25 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar34 = (ulong)(*(long *)ip * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
      local_e8 = (ulong)(*(long *)((long)ip + 1) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
      goto LAB_0059e96d;
    default:
      uVar34 = (ulong)(*ip * -0x61c8864f >> (bVar20 & 0x1f));
      local_e8 = (ulong)((uint)(*(int *)((long)ip + 1) * -0x61c8864f) >> (bVar20 & 0x1f));
      goto LAB_0059e96d;
    }
    uVar34 = (ulong)(*(long *)ip * lVar25) >> (bVar19 & 0x3f);
    local_e8 = (ulong)(lVar25 * *(long *)((long)ip + 1)) >> (bVar19 & 0x3f);
LAB_0059e96d:
    puVar41 = ip + 0x20;
    uVar29 = (ulong)pUVar6[uVar34];
    puVar17 = (uint *)(uVar16 + (long)ip);
    puVar26 = (uint *)((long)ip + 1);
    iend = ip;
    pBVar30 = pBVar5;
    uVar39 = uVar16;
    if (pUVar6[uVar34] < uVar15) {
      pBVar30 = pBVar7;
    }
    while( true ) {
      puVar23 = puVar17;
      uVar21 = ((int)puVar23 - iVar11) - uVar31;
      pBVar28 = pBVar5;
      if (uVar21 < uVar15) {
        pBVar28 = pBVar7;
      }
      if ((uVar31 == 0) || (uVar15 - uVar21 < 4)) {
        uVar33 = *puVar23 ^ 1;
      }
      else {
        uVar33 = *(uint *)(pBVar28 + uVar21);
      }
      uVar32 = (int)iend - iVar11;
      pUVar6[uVar34] = uVar32;
      puVar17 = puVar26;
      puVar38 = iEnd;
      if (*puVar23 == uVar33) {
        pBVar28 = pBVar28 + uVar21;
        if ((pBVar28 == iStart) || (pBVar28 == pBVar7 + uVar9)) {
          __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                        ,0x314,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        if (uVar21 < uVar15) {
          puVar38 = puVar22;
        }
        uVar34 = (ulong)(*(BYTE *)((long)puVar23 - 1) == pBVar28[-1]);
        iend = (uint *)((long)puVar23 - uVar34);
        pBVar30 = pBVar28 + -uVar34;
        uVar34 = uVar34 | 4;
        UVar40 = 1;
        uVar21 = uVar31;
        goto LAB_0059ec69;
      }
      if ((uVar9 <= (uint)uVar29) && (*iend == *(uint *)(pBVar30 + uVar29))) break;
      uVar21 = pUVar6[local_e8];
      uVar29 = (ulong)uVar21;
      pBVar30 = pBVar5;
      if (uVar21 < uVar15) {
        pBVar30 = pBVar7;
      }
      switch(uVar24) {
      case 0:
        lVar25 = -0x30e4432345000000;
        break;
      case 1:
        lVar25 = -0x30e4432340650000;
        break;
      case 2:
        lVar25 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar34 = *(long *)puVar23 * -0x30e44323485a9b9d;
        goto LAB_0059ea93;
      default:
        uVar34 = (ulong)(*puVar23 * -0x61c8864f >> (bVar20 & 0x1f));
        goto LAB_0059ea9a;
      }
      uVar34 = lVar25 * *(long *)puVar23;
LAB_0059ea93:
      uVar34 = uVar34 >> (bVar19 & 0x3f);
LAB_0059ea9a:
      uVar32 = (int)puVar26 - iVar11;
      pUVar6[local_e8] = uVar32;
      if ((uVar9 <= uVar21) &&
         (puVar17 = puVar23, iend = puVar26, local_e8 = uVar34,
         *puVar26 == *(uint *)(pBVar30 + uVar29))) break;
      uVar29 = (ulong)pUVar6[uVar34];
      pBVar30 = pBVar5;
      if (pUVar6[uVar34] < uVar15) {
        pBVar30 = pBVar7;
      }
      switch(uVar24) {
      case 0:
        lVar25 = -0x30e4432345000000;
        break;
      case 1:
        lVar25 = -0x30e4432340650000;
        break;
      case 2:
        lVar25 = -0x30e44323405a9d00;
        break;
      case 3:
        local_e8 = *(long *)puVar37 * -0x30e44323485a9b9d;
        goto LAB_0059eb3d;
      default:
        local_e8 = (ulong)(*puVar37 * -0x61c8864f >> (bVar20 & 0x1f));
        goto LAB_0059eb44;
      }
      local_e8 = lVar25 * *(long *)puVar37;
LAB_0059eb3d:
      local_e8 = local_e8 >> (bVar19 & 0x3f);
LAB_0059eb44:
      uVar27 = uVar39;
      if (puVar41 <= (uint *)((long)puVar23 + uVar39)) {
        puVar41 = puVar41 + 0x20;
        uVar27 = uVar39 + 1;
      }
      puVar38 = (uint *)(uVar39 + (long)puVar37);
      puVar17 = (uint *)((long)puVar23 + uVar39);
      puVar26 = puVar37;
      iend = puVar23;
      uVar39 = uVar27;
      puVar37 = puVar38;
      if (puVar1 <= puVar38) goto LAB_0059f137;
    }
    pBVar28 = iStart;
    if ((uint)uVar29 < uVar15) {
      puVar38 = puVar22;
      pBVar28 = pBVar7 + uVar9;
    }
    uVar21 = uVar32 - (uint)uVar29;
    if (uVar21 == 0) {
      __assert_fail("(offset)>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x374,
                    "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pBVar30 = pBVar30 + uVar29;
    UVar40 = uVar21 + 3;
    uVar34 = 4;
    for (; ((local_fc = uVar31, pBVar28 < pBVar30 && (ip < iend)) &&
           (*(BYTE *)((long)iend + -1) == pBVar30[-1])); iend = (uint *)((long)iend + -1)) {
      pBVar30 = pBVar30 + -1;
      uVar34 = uVar34 + 1;
    }
LAB_0059ec69:
    if (puVar38 == (uint *)0x0) {
      __assert_fail("matchEnd != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x381,
                    "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    sVar18 = ZSTD_count_2segments
                       ((BYTE *)((long)iend + uVar34),pBVar30 + uVar34,(BYTE *)iEnd,(BYTE *)puVar38,
                        iStart);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0059f18a:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0059f1c8:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar39 = (long)iend - (long)ip;
    pBVar30 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar30 + uVar39) {
LAB_0059f206:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < iend) {
LAB_0059f1e7:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar30,(BYTE *)ip,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_0059ed18:
      seqStore->lit = seqStore->lit + uVar39;
      if (0xffff < uVar39) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar10 = *(undefined8 *)(ip + 2);
      *(undefined8 *)pBVar30 = *(undefined8 *)ip;
      *(undefined8 *)(pBVar30 + 8) = uVar10;
      pBVar30 = seqStore->lit;
      if (0x10 < uVar39) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar30 + 0x10 + (-0x10 - (long)(ip + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar10 = *(undefined8 *)(ip + 6);
        *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(ip + 4);
        *(undefined8 *)(pBVar30 + 0x18) = uVar10;
        if (0x20 < (long)uVar39) {
          lVar25 = 0;
          do {
            puVar2 = (undefined8 *)((long)ip + lVar25 + 0x20);
            uVar10 = puVar2[1];
            pBVar28 = pBVar30 + lVar25 + 0x20;
            *(undefined8 *)pBVar28 = *puVar2;
            *(undefined8 *)(pBVar28 + 8) = uVar10;
            puVar2 = (undefined8 *)((long)ip + lVar25 + 0x30);
            uVar10 = puVar2[1];
            *(undefined8 *)(pBVar28 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar28 + 0x18) = uVar10;
            lVar25 = lVar25 + 0x20;
          } while (pBVar28 + 0x20 < pBVar30 + uVar39);
        }
        goto LAB_0059ed18;
      }
      seqStore->lit = pBVar30 + uVar39;
    }
    uVar34 = sVar18 + uVar34;
    psVar35 = seqStore->sequences;
    psVar35->litLength = (U16)uVar39;
    psVar35->offBase = UVar40;
    if (uVar34 < 3) {
LAB_0059f1a9:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar34 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0059f225:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar35->mlBase = (U16)(uVar34 - 3);
    psVar35 = psVar35 + 1;
    seqStore->sequences = psVar35;
    ip = (uint *)((long)iend + uVar34);
    if (puVar17 < ip) {
      pUVar6[local_e8] = (int)puVar17 - iVar11;
    }
    uVar31 = uVar21;
    if (ip <= puVar1) {
      if (pBVar5 + (ulong)uVar32 + 2 <= src) {
        __assert_fail("base+current0+2 > istart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                      ,0x391,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      if (uVar13 < 4) {
        sVar18 = (*(code *)(&DAT_0070507c + *(int *)(&DAT_0070507c + uVar24 * 4)))();
        return sVar18;
      }
      pUVar6[(uint)(*(int *)(pBVar5 + (ulong)uVar32 + 2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
           uVar32 + 2;
      pUVar6[(uint)(*(int *)((long)ip + -2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
           ((int)ip + -2) - iVar11;
      uVar21 = local_fc;
      for (; local_fc = uVar21, ip <= puVar1; ip = (uint *)((long)ip + sVar18 + 4)) {
        UVar40 = (int)ip - iVar11;
        uVar21 = UVar40 - local_fc;
        pBVar30 = pBVar5;
        if (uVar21 < uVar15) {
          pBVar30 = pBVar7;
        }
        if (((local_fc == 0) || (0xfffffffc < uVar21 - uVar15)) ||
           (*(uint *)(pBVar30 + uVar21) != *ip)) break;
        puVar37 = iEnd;
        if (uVar21 < uVar15) {
          puVar37 = puVar22;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar30 + uVar21) + 4),(BYTE *)iEnd,
                            (BYTE *)puVar37,iStart);
        if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
        goto LAB_0059f18a;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0059f1c8;
        puVar37 = (uint *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar37) goto LAB_0059f206;
        if (iEnd < ip) goto LAB_0059f1e7;
        if (ilimit_w < ip) {
          ZSTD_safecopyLiterals((BYTE *)puVar37,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
        }
        else {
          uVar21 = ip[1];
          uVar33 = ip[2];
          uVar32 = ip[3];
          *puVar37 = *ip;
          puVar37[1] = uVar21;
          puVar37[2] = uVar33;
          puVar37[3] = uVar32;
        }
        psVar35 = seqStore->sequences;
        psVar35->litLength = 0;
        psVar35->offBase = 1;
        if (sVar18 + 4 < 3) goto LAB_0059f1a9;
        if (0xffff < sVar18 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0059f225;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar35->mlBase = (U16)(sVar18 + 1);
        psVar35 = psVar35 + 1;
        seqStore->sequences = psVar35;
        if (uVar13 < 4) {
          sVar18 = (*(code *)(&DAT_0070508c + *(int *)(&DAT_0070508c + uVar24 * 4)))();
          return sVar18;
        }
        pUVar6[*ip * -0x61c8864f >> (bVar20 & 0x1f)] = UVar40;
        uVar21 = uVar31;
        uVar31 = local_fc;
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}